

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTRefCount.cpp
# Opt level: O0

ASTRef * antlr::ASTRef::getRef(AST *p)

{
  AST *in_RDI;
  AST *pp;
  ASTRef *local_8;
  
  if (in_RDI == (AST *)0x0) {
    local_8 = (ASTRef *)0x0;
  }
  else if (in_RDI->ref == (ASTRef *)0x0) {
    local_8 = (ASTRef *)operator_new(0x10);
    ASTRef(local_8,in_RDI);
  }
  else {
    local_8 = increment(in_RDI->ref);
  }
  return local_8;
}

Assistant:

ASTRef* ASTRef::getRef(const AST* p)
{
	if (p) {
		AST* pp = const_cast<AST*>(p);
		if (pp->ref)
			return pp->ref->increment();
		else
			return new ASTRef(pp);
	} else
		return 0;
}